

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask29_32(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  long unaff_RBX;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  
  vpmovsxbd_avx(ZEXT416(0x34302c24));
  auVar4 = vpmovsxbd_avx(ZEXT416(0x7040100));
  auVar7 = vpmovsxbd_avx512f(_DAT_0018b810);
  auVar14 = vpsrlvd_avx2(*(undefined1 (*) [32])(this + 4),_DAT_001940c0);
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar3 = vpinsrd_avx(auVar6,*(int *)(this + 0x28) << 2,0);
  auVar8 = vinserti32x4_avx512f(ZEXT3264(*(undefined1 (*) [32])(this + 4)),auVar6,2);
  auVar16 = vpinsrd_avx(auVar4,auVar6._0_4_ >> 0x1b,0);
  auVar4 = vpsrlvd_avx2(auVar6,auVar4);
  auVar9 = vpmovsxbd_avx512f(_DAT_0018b7f0);
  auVar3 = vpor_avx(auVar3,auVar16);
  auVar3 = vpblendd_avx2(auVar4,auVar3,1);
  auVar10 = vpbroadcastd_avx512f();
  auVar11._0_48_ = auVar8._0_48_;
  auVar11._48_4_ = auVar10._48_4_;
  auVar11._52_4_ = auVar8._52_4_;
  auVar11._56_4_ = auVar8._56_4_;
  auVar11._60_4_ = auVar8._60_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(this + 0x3c);
  auVar16 = vpsrlvd_avx2(auVar16,_DAT_00197d40);
  auVar8 = vpermi2d_avx512f(auVar9,auVar11,ZEXT864(*(ulong *)(this + 0x3c)));
  auVar9 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(this + 0x44)));
  auVar7 = vpermi2d_avx512f(auVar7,ZEXT3264(auVar14),ZEXT464(*(uint *)this));
  auVar10 = vpmovsxbd_avx512f(_DAT_0018b820);
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar12 = vmovdqa32_avx512f(auVar9);
  auVar12._0_60_ = auVar8._0_60_;
  auVar8 = vpsllvd_avx512f(auVar12,_DAT_001a8ac0);
  auVar7 = vpermi2d_avx512f(auVar10,auVar7,ZEXT1664(auVar3));
  auVar10 = vpbroadcastd_avx512f();
  auVar13._0_52_ = auVar7._0_52_;
  auVar13._52_4_ = auVar10._52_4_;
  auVar13._56_4_ = auVar7._56_4_;
  auVar13._60_4_ = auVar7._60_4_;
  iVar1 = *(int *)(this + 0x54);
  auVar7 = vpermi2q_avx512f(auVar11,auVar13,ZEXT1664(auVar16));
  vpmovsxbd_avx(ZEXT416(0x684c4850));
  auVar7 = vpord_avx512f(auVar8,auVar7);
  auVar7 = vmovdqu64_avx512f(auVar7);
  *(undefined1 (*) [64])in = auVar7;
  auVar3 = *(undefined1 (*) [16])(this + 0x58);
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)(this + unaff_RBX));
  auVar4 = vpblendd_avx2(auVar6,auVar9._0_16_,1);
  auVar16 = vpinsrd_avx(auVar6,iVar1 * 2,3);
  uVar2 = *(uint *)(this + 0x78);
  auVar14._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
  auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  auVar15._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar6;
  auVar15._16_16_ = ZEXT116(1) * auVar3;
  auVar5 = vpsllvd_avx2(auVar15,_DAT_001a58e0);
  auVar15 = vpsrlvd_avx2(auVar14,_DAT_001a58c0);
  auVar3 = vpinsrd_avx(auVar6,auVar6._0_4_ >> 0x1c,3);
  iVar1 = *(int *)(this + 0x7c);
  auVar3 = vpor_avx(auVar16,auVar3);
  auVar14 = vpmovsxbd_avx2(ZEXT816(0x307060504000201));
  auVar15 = vpblendd_avx2(auVar15,ZEXT1632(auVar3),8);
  auVar14 = vpermd_avx2(auVar14,auVar5);
  auVar14 = vpor_avx2(auVar14,auVar15);
  *(undefined1 (*) [32])(in + 0x10) = auVar14;
  auVar3 = vpalignr_avx(*(undefined1 (*) [16])(this + 0x6c),auVar6,0xc);
  auVar16 = vpsrlvd_avx2(auVar3,_DAT_00198240);
  auVar3 = vpsllvd_avx2(*(undefined1 (*) [16])(this + 0x6c),_DAT_00199e80);
  auVar3 = vpor_avx(auVar3,auVar16);
  *(undefined1 (*) [16])(in + 0x18) = auVar3;
  in[0x1c] = iVar1 << 3 | uVar2 >> 0x1a;
  return in + 0x1d;
}

Assistant:

uint32_t *__fastpackwithoutmask29_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (29 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (29 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (29 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (29 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (29 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (29 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (29 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (29 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++out;
  *out = ((*in)) >> (29 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (29 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (29 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (29 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (29 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (29 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (29 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (29 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (29 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (29 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  *out = ((*in)) >> (29 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (29 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (29 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (29 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (29 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (29 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (29 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (29 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (29 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (29 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++out;
  ++in;

  return out;
}